

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

void __thiscall QTextStream::setGenerateByteOrderMark(QTextStream *this,bool generate)

{
  QTextStreamPrivate *pQVar1;
  long in_FS_OFFSET;
  QStringConverter local_48;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr)._M_t.
           super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
           super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  if ((pQVar1->hasWrittenData == false) && (pQVar1->generateBOM != generate)) {
    pQVar1->generateBOM = generate;
    local_48.state.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
    super_QFlagsStorage<QStringConverterBase::Flag>.i =
         (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)((uint)generate << 2);
    local_48.iface = QStringConverter::encodingInterfaces + pQVar1->encoding;
    local_48.state._4_8_ = 0;
    local_48.state._12_8_ = 0;
    local_48.state._20_8_ = 0;
    local_48.state.field_4.state_data[1] = 0;
    local_48.state.field_4.state_data[2] = 0;
    local_48.state.field_4.state_data[3] = 0;
    local_48.state.clearFn = (ClearDataFn)0x0;
    QStringConverter::operator=(&(pQVar1->fromUtf16).super_QStringConverter,&local_48);
    QStringConverterBase::State::clear(&local_48.state);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextStream::setGenerateByteOrderMark(bool generate)
{
    Q_D(QTextStream);
    if (d->hasWrittenData || d->generateBOM == generate)
        return;

    d->generateBOM = generate;
    d->fromUtf16 = QStringEncoder(d->encoding, generate ? QStringConverter::Flag::WriteBom : QStringConverter::Flag::Default);
}